

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

errr finish_parse_pit(parser *p)

{
  ushort uVar1;
  pit_profile *ppVar2;
  long *plVar3;
  undefined8 *p_00;
  uint16_t uVar4;
  ulong uVar5;
  long lVar6;
  undefined8 *puVar7;
  pit_profile *ppVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  byte bVar12;
  
  bVar12 = 0;
  z_info->pit_max = 0;
  plVar3 = (long *)parser_priv(p);
  uVar4 = z_info->pit_max;
  if (plVar3 != (long *)0x0) {
    do {
      uVar4 = uVar4 + 1;
      plVar3 = (long *)*plVar3;
    } while (plVar3 != (long *)0x0);
    z_info->pit_max = uVar4;
  }
  pit_info = (pit_profile *)mem_zalloc((ulong)uVar4 * 0x78 + 0x78);
  uVar1 = z_info->pit_max;
  p_00 = (undefined8 *)parser_priv(p);
  if (p_00 != (undefined8 *)0x0) {
    lVar11 = (ulong)uVar1 * 0x78;
    uVar10 = (ulong)uVar1;
    do {
      uVar9 = uVar10 - 1;
      if (lVar11 == 0) {
        __assert_fail("pit_idx >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                      ,0x9be,"errr finish_parse_pit(struct parser *)");
      }
      uVar5 = uVar9 & 0xffffffff;
      puVar7 = p_00;
      ppVar8 = pit_info + uVar5;
      for (lVar6 = 0xf; ppVar2 = pit_info, lVar6 != 0; lVar6 = lVar6 + -1) {
        ppVar8->next = (pit_profile *)*puVar7;
        puVar7 = puVar7 + (ulong)bVar12 * -2 + 1;
        ppVar8 = (pit_profile *)((long)ppVar8 + (ulong)bVar12 * -0x10 + 8);
      }
      pit_info[uVar5].pit_idx = (wchar_t)uVar9;
      puVar7 = (undefined8 *)*p_00;
      ppVar8 = (pit_profile *)(ppVar2->flags + lVar11 + -0x28);
      if (z_info->pit_max <= uVar10) {
        ppVar8 = (pit_profile *)0x0;
      }
      ppVar2[uVar5].next = ppVar8;
      mem_free(p_00);
      lVar11 = lVar11 + -0x78;
      p_00 = puVar7;
      uVar10 = uVar9;
    } while (puVar7 != (undefined8 *)0x0);
  }
  z_info->pit_max = z_info->pit_max + 1;
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_pit(struct parser *p) {
	struct pit_profile *pit, *n;
	int pit_idx;
		
	/* Scan the list for the max id */
	z_info->pit_max = 0;
	pit = parser_priv(p);
	while (pit) {
		z_info->pit_max++;
		pit = pit->next;
	}

	/* Allocate the direct access list and copy the data to it */
	pit_info = mem_zalloc((z_info->pit_max + 1) * sizeof(*pit));
	pit_idx = z_info->pit_max - 1;
	for (pit = parser_priv(p); pit; pit = n, pit_idx--) {
		assert(pit_idx >= 0);

		memcpy(&pit_info[pit_idx], pit, sizeof(*pit));
		pit_info[pit_idx].pit_idx = pit_idx;
		n = pit->next;
		if (pit_idx < z_info->pit_max - 1)
			pit_info[pit_idx].next = &pit_info[pit_idx + 1];
		else
			pit_info[pit_idx].next = NULL;

		mem_free(pit);
	}
	z_info->pit_max += 1;

	parser_destroy(p);
	return 0;
}